

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O1

Vec_Int_t * Abc_NtkRetimeCollectLatchValues(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  iVar9 = pNtk->nObjCounts[8];
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar5->pArray = piVar6;
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      pvVar3 = pVVar7->pArray[lVar10];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 8)) {
        lVar4 = *(long *)((long)pvVar3 + 0x38);
        uVar1 = pVVar5->nSize;
        uVar2 = pVVar5->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc(0x40);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,0x40);
            }
            pVVar5->pArray = piVar6;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar2 * 2;
            if (iVar9 <= (int)uVar2) goto LAB_004ccc35;
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((ulong)uVar2 << 3);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,(ulong)uVar2 << 3);
            }
            pVVar5->pArray = piVar6;
          }
          if (piVar6 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar5->nCap = iVar9;
        }
LAB_004ccc35:
        pVVar5->nSize = uVar1 + 1;
        pVVar5->pArray[(int)uVar1] = (uint)(lVar4 == 2);
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar10 < pVVar7->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkRetimeCollectLatchValues( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vValues;
    Abc_Obj_t * pObj;
    int i;
    vValues = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            Vec_IntPush( vValues, Abc_LatchIsInit1(pObj) );
    return vValues;
}